

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_graph.cpp
# Opt level: O2

void Omega_h::map_into<int>(Read<int> *a_data,Graph *a2b,Write<int> *b_data,Int width)

{
  Read<int> ab_data;
  Write<int> local_80;
  Write<int> local_70;
  Write<int> local_60;
  Write<int> local_50;
  Write<int> local_40;
  Write<int> local_30;
  
  Write<int>::Write(&local_40,&a_data->write_);
  Write<int>::Write(&local_50,(Write<int> *)a2b);
  expand<int>((Omega_h *)&local_30,(Read<int> *)&local_40,(LOs *)&local_50,width);
  Write<int>::~Write(&local_50);
  Write<int>::~Write(&local_40);
  Write<int>::Write(&local_60,&local_30);
  Write<int>::Write(&local_70,&(a2b->ab2b).write_);
  Write<int>::Write(&local_80,b_data);
  map_into<int>((Read<int> *)&local_60,(LOs *)&local_70,&local_80,width);
  Write<int>::~Write(&local_80);
  Write<int>::~Write(&local_70);
  Write<int>::~Write(&local_60);
  Write<int>::~Write(&local_30);
  return;
}

Assistant:

void map_into(Read<T> a_data, Graph a2b, Write<T> b_data, Int width) {
  auto ab_data = expand(a_data, a2b.a2ab, width);
  map_into(ab_data, a2b.ab2b, b_data, width);
}